

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve64_CP32_SHA512.c
# Opt level: O2

uint32_t Hacl_HPKE_Curve64_CP32_SHA512_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint32_t i;
  long lVar12;
  uint8_t *puVar13;
  ulong uVar14;
  uint ikmlen;
  uint32_t prklen;
  byte bVar15;
  undefined8 uStack_3f0;
  uint8_t auStack_3e8 [6];
  undefined2 uStack_3e2;
  undefined1 uStack_3e0;
  undefined8 uStack_3df;
  undefined2 uStack_3d7;
  undefined8 uStack_3d5;
  undefined2 uStack_3cd;
  uint8_t auStack_3cb [9];
  undefined8 auStack_3c2 [8];
  uint8_t auStack_382 [8];
  uint8_t auStack_37a [8];
  uint8_t auStack_372 [8];
  uint8_t auStack_36a [8];
  uint8_t auStack_362 [8];
  uint8_t auStack_35a [8];
  uint8_t auStack_352 [10];
  uint8_t auStack_348 [6];
  undefined2 uStack_342;
  undefined1 uStack_340;
  undefined8 uStack_33f;
  undefined2 uStack_337;
  uint8_t auStack_335 [4];
  uint8_t auStack_331 [8];
  undefined8 auStack_329 [8];
  uint8_t auStack_2e9 [8];
  uint8_t auStack_2e1 [8];
  uint8_t auStack_2d9 [8];
  uint8_t auStack_2d1 [8];
  uint8_t auStack_2c9 [8];
  uint8_t auStack_2c1 [8];
  uint8_t auStack_2b9 [9];
  undefined8 uStack_2b0;
  uint8_t auStack_2a8 [6];
  undefined2 uStack_2a2;
  undefined1 uStack_2a0;
  undefined8 uStack_29f;
  undefined2 uStack_297;
  uint8_t auStack_295 [4];
  uint8_t auStack_291 [8];
  undefined8 auStack_289 [3];
  undefined1 auStack_270 [8];
  uint8_t local_268 [7];
  undefined1 auStack_261 [8];
  undefined1 auStack_259 [8];
  undefined1 auStack_251 [8];
  uint8_t auStack_249 [4];
  undefined8 uStack_245;
  undefined8 local_23d;
  undefined8 uStack_235;
  undefined8 local_22d;
  undefined8 uStack_225;
  undefined8 local_21d;
  undefined5 uStack_215;
  undefined3 uStack_210;
  undefined5 uStack_20d;
  uint8_t local_208 [4];
  undefined2 local_204;
  undefined1 local_202;
  undefined4 local_201;
  undefined1 local_1fd;
  undefined1 local_1fc [4];
  undefined1 auStack_1f8 [3];
  undefined1 local_1f5 [5];
  undefined3 uStack_1f0;
  undefined5 uStack_1ed;
  undefined4 uStack_1e8;
  undefined2 uStack_1e4;
  uint8_t uStack_1e2;
  undefined4 uStack_1e1;
  undefined4 uStack_1dd;
  undefined2 uStack_1d9;
  undefined1 auStack_1d7 [8];
  undefined1 auStack_1cf [3];
  undefined4 uStack_1cc;
  undefined8 uStack_1c8;
  uint8_t o_info_hash [64];
  uint8_t o_eae_prk [32];
  uint8_t auStack_148 [8];
  uint8_t zeros [32];
  undefined8 local_108;
  undefined2 local_100;
  uint8_t auStack_f8 [8];
  uint8_t o_shared [32];
  undefined8 uStack_b8;
  uint8_t o_dh [32];
  
  o_shared[8] = '\0';
  o_shared[9] = '\0';
  o_shared[10] = '\0';
  o_shared[0xb] = '\0';
  o_shared[0xc] = '\0';
  o_shared[0xd] = '\0';
  o_shared[0xe] = '\0';
  o_shared[0xf] = '\0';
  o_shared[0x10] = '\0';
  o_shared[0x11] = '\0';
  o_shared[0x12] = '\0';
  o_shared[0x13] = '\0';
  o_shared[0x14] = '\0';
  o_shared[0x15] = '\0';
  o_shared[0x16] = '\0';
  o_shared[0x17] = '\0';
  auStack_f8[0] = '\0';
  auStack_f8[1] = '\0';
  auStack_f8[2] = '\0';
  auStack_f8[3] = '\0';
  auStack_f8[4] = '\0';
  auStack_f8[5] = '\0';
  auStack_f8[6] = '\0';
  auStack_f8[7] = '\0';
  o_shared[0] = '\0';
  o_shared[1] = '\0';
  o_shared[2] = '\0';
  o_shared[3] = '\0';
  o_shared[4] = '\0';
  o_shared[5] = '\0';
  o_shared[6] = '\0';
  o_shared[7] = '\0';
  stack0xfffffffffffffe30 = 0x167afd;
  uStack_1cc = 0;
  Hacl_Curve25519_64_secret_to_public(o_pkE,skE);
  o_dh[8] = '\0';
  o_dh[9] = '\0';
  o_dh[10] = '\0';
  o_dh[0xb] = '\0';
  o_dh[0xc] = '\0';
  o_dh[0xd] = '\0';
  o_dh[0xe] = '\0';
  o_dh[0xf] = '\0';
  o_dh[0x10] = '\0';
  o_dh[0x11] = '\0';
  o_dh[0x12] = '\0';
  o_dh[0x13] = '\0';
  o_dh[0x14] = '\0';
  o_dh[0x15] = '\0';
  o_dh[0x16] = '\0';
  o_dh[0x17] = '\0';
  uStack_b8 = 0;
  o_dh[0] = '\0';
  o_dh[1] = '\0';
  o_dh[2] = '\0';
  o_dh[3] = '\0';
  o_dh[4] = '\0';
  o_dh[5] = '\0';
  o_dh[6] = '\0';
  o_dh[7] = '\0';
  zeros[8] = '\0';
  zeros[9] = '\0';
  zeros[10] = '\0';
  zeros[0xb] = '\0';
  zeros[0xc] = '\0';
  zeros[0xd] = '\0';
  zeros[0xe] = '\0';
  zeros[0xf] = '\0';
  zeros[0x10] = '\0';
  zeros[0x11] = '\0';
  zeros[0x12] = '\0';
  zeros[0x13] = '\0';
  zeros[0x14] = '\0';
  zeros[0x15] = '\0';
  zeros[0x16] = '\0';
  zeros[0x17] = '\0';
  auStack_148[0] = '\0';
  auStack_148[1] = '\0';
  auStack_148[2] = '\0';
  auStack_148[3] = '\0';
  auStack_148[4] = '\0';
  auStack_148[5] = '\0';
  auStack_148[6] = '\0';
  auStack_148[7] = '\0';
  zeros[0] = '\0';
  zeros[1] = '\0';
  zeros[2] = '\0';
  zeros[3] = '\0';
  zeros[4] = '\0';
  zeros[5] = '\0';
  zeros[6] = '\0';
  zeros[7] = '\0';
  stack0xfffffffffffffe30 = 0x167b27;
  uStack_1cc = 0;
  Hacl_Curve25519_64_scalarmult((uint8_t *)&uStack_b8,skE,pkR);
  bVar15 = 0xff;
  for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
    stack0xfffffffffffffe30 = 0x167b4a;
    uStack_1cc = 0;
    bVar9 = FStar_UInt8_eq_mask(o_dh[lVar12 + -8],zeros[lVar12 + -8]);
    bVar15 = bVar15 & bVar9;
  }
  if (bVar15 != 0xff) {
    uVar1 = *(undefined8 *)o_pkE;
    uVar2 = *(undefined8 *)(o_pkE + 8);
    uVar3 = *(undefined8 *)(o_pkE + 0x10);
    uVar4 = *(undefined8 *)(o_pkE + 0x18);
    uVar5 = *(undefined8 *)pkR;
    uVar6 = *(undefined8 *)(pkR + 8);
    uVar7 = *(undefined8 *)(pkR + 0x10);
    uVar8 = *(undefined8 *)(pkR + 0x18);
    o_info_hash[0x38] = '\0';
    o_info_hash[0x39] = '\0';
    o_info_hash[0x3a] = '\0';
    o_info_hash[0x3b] = '\0';
    o_info_hash[0x3c] = '\0';
    o_info_hash[0x3d] = '\0';
    o_info_hash[0x3e] = '\0';
    o_info_hash[0x3f] = '\0';
    uStack_1c8 = CONCAT35(uStack_1c8._5_3_,0x20004d454b);
    builtin_memcpy(local_208,"HPKE",4);
    local_204 = 0x762d;
    local_202 = 0x31;
    local_201 = 0x4d454b;
    local_1fd = 0x20;
    local_1fc = (undefined1  [4])0x5f656165;
    auStack_1f8 = (undefined1  [3])0x6b7270;
    local_1f5 = SUB85(uStack_b8,0);
    uStack_1f0 = (undefined3)((ulong)uStack_b8 >> 0x28);
    uStack_1ed = (undefined5)o_dh._0_8_;
    uStack_1e8._0_3_ = SUB83(o_dh._0_8_,5);
    uStack_1e8._3_1_ = (uint8_t)o_dh._8_8_;
    uStack_1e4 = SUB82(o_dh._8_8_,1);
    uStack_1e2 = SUB81(o_dh._8_8_,3);
    uStack_1e1 = SUB84(o_dh._8_8_,4);
    uStack_1dd = (undefined4)o_dh._16_8_;
    uStack_1d9 = SUB82(o_dh._16_8_,4);
    auStack_1d7._0_2_ = SUB82(o_dh._16_8_,6);
    uStack_210 = 0x167c13;
    uStack_20d = 0;
    Hacl_HKDF_extract_sha2_256(o_info_hash + 0x38,(uint8_t *)&uStack_1c8,0,local_208,0x33);
    local_268[0] = '\0';
    local_268[1] = ' ';
    local_268[2] = 'H';
    local_268[3] = 'P';
    local_268[4] = 'K';
    local_268[5] = 'E';
    stack0xfffffffffffffd9e = 0x762d;
    auStack_261[1] = 0x31;
    auStack_261._2_4_ = (undefined4)uStack_1c8;
    auStack_261[6] = uStack_1c8._4_1_;
    stack0xfffffffffffffda6 = 0x6572616873;
    auStack_259._4_3_ = 0x735f64;
    stack0xfffffffffffffdae = 0x7465726365;
    uStack_215 = (undefined5)uVar8;
    uStack_210 = (undefined3)((ulong)uVar8 >> 0x28);
    auStack_270 = (undefined1  [8])0x167c9a;
    unique0x100029b6 = uVar1;
    uStack_245 = uVar2;
    local_23d = uVar3;
    uStack_235 = uVar4;
    local_22d = uVar5;
    uStack_225 = uVar6;
    local_21d = uVar7;
    Hacl_HKDF_expand_sha2_256(auStack_f8,o_info_hash + 0x38,0x20,local_268,0x5b,0x20);
    local_108 = 0x3002000454b5048;
    zeros[0x18] = '\0';
    zeros[0x19] = '\0';
    zeros[0x1a] = '\0';
    zeros[0x1b] = '\0';
    zeros[0x1c] = '\0';
    zeros[0x1d] = '\0';
    zeros[0x1e] = '\0';
    zeros[0x1f] = '\0';
    zeros[8] = '\0';
    zeros[9] = '\0';
    zeros[10] = '\0';
    zeros[0xb] = '\0';
    zeros[0xc] = '\0';
    zeros[0xd] = '\0';
    zeros[0xe] = '\0';
    zeros[0xf] = '\0';
    zeros[0x10] = '\0';
    zeros[0x11] = '\0';
    zeros[0x12] = '\0';
    zeros[0x13] = '\0';
    zeros[0x14] = '\0';
    zeros[0x15] = '\0';
    zeros[0x16] = '\0';
    zeros[0x17] = '\0';
    auStack_148[0] = '\0';
    auStack_148[1] = '\0';
    auStack_148[2] = '\0';
    auStack_148[3] = '\0';
    auStack_148[4] = '\0';
    auStack_148[5] = '\0';
    auStack_148[6] = '\0';
    auStack_148[7] = '\0';
    zeros[0] = '\0';
    zeros[1] = '\0';
    zeros[2] = '\0';
    zeros[3] = '\0';
    zeros[4] = '\0';
    zeros[5] = '\0';
    zeros[6] = '\0';
    zeros[7] = '\0';
    local_100 = 0x300;
    o_info_hash[0x38] = '\0';
    o_info_hash[0x39] = '\0';
    o_info_hash[0x3a] = '\0';
    o_info_hash[0x3b] = '\0';
    o_info_hash[0x3c] = '\0';
    o_info_hash[0x3d] = '\0';
    o_info_hash[0x3e] = '\0';
    o_info_hash[0x3f] = '\0';
    uStack_1e8 = 0x454b5048;
    uStack_1e4 = 0x762d;
    uStack_1e2 = '1';
    uStack_1e1 = 0x454b5048;
    uStack_1dd = 0x3002000;
    uStack_1d9 = 0x300;
    auStack_1d7._0_2_ = 0x7370;
    auStack_1d7._2_5_ = 0x5f64695f6b;
    stack0xfffffffffffffe30 = 0x68736168;
    uStack_1f0 = 0x167d43;
    uStack_1ed = 0;
    Hacl_HKDF_extract_sha2_512
              (o_info_hash + 0x38,(uint8_t *)&local_108,0,(uint8_t *)&uStack_1e8,0x1c);
    o_info_hash[0x28] = '\0';
    o_info_hash[0x29] = '\0';
    o_info_hash[0x2a] = '\0';
    o_info_hash[0x2b] = '\0';
    o_info_hash[0x2c] = '\0';
    o_info_hash[0x2d] = '\0';
    o_info_hash[0x2e] = '\0';
    o_info_hash[0x2f] = '\0';
    o_info_hash[0x30] = '\0';
    o_info_hash[0x31] = '\0';
    o_info_hash[0x32] = '\0';
    o_info_hash[0x33] = '\0';
    o_info_hash[0x34] = '\0';
    o_info_hash[0x35] = '\0';
    o_info_hash[0x36] = '\0';
    o_info_hash[0x37] = '\0';
    o_info_hash[0x18] = '\0';
    o_info_hash[0x19] = '\0';
    o_info_hash[0x1a] = '\0';
    o_info_hash[0x1b] = '\0';
    o_info_hash[0x1c] = '\0';
    o_info_hash[0x1d] = '\0';
    o_info_hash[0x1e] = '\0';
    o_info_hash[0x1f] = '\0';
    o_info_hash[0x20] = '\0';
    o_info_hash[0x21] = '\0';
    o_info_hash[0x22] = '\0';
    o_info_hash[0x23] = '\0';
    o_info_hash[0x24] = '\0';
    o_info_hash[0x25] = '\0';
    o_info_hash[0x26] = '\0';
    o_info_hash[0x27] = '\0';
    o_info_hash[8] = '\0';
    o_info_hash[9] = '\0';
    o_info_hash[10] = '\0';
    o_info_hash[0xb] = '\0';
    o_info_hash[0xc] = '\0';
    o_info_hash[0xd] = '\0';
    o_info_hash[0xe] = '\0';
    o_info_hash[0xf] = '\0';
    o_info_hash[0x10] = '\0';
    o_info_hash[0x11] = '\0';
    o_info_hash[0x12] = '\0';
    o_info_hash[0x13] = '\0';
    o_info_hash[0x14] = '\0';
    o_info_hash[0x15] = '\0';
    o_info_hash[0x16] = '\0';
    o_info_hash[0x17] = '\0';
    uStack_1c8 = 0;
    o_info_hash[0] = '\0';
    o_info_hash[1] = '\0';
    o_info_hash[2] = '\0';
    o_info_hash[3] = '\0';
    o_info_hash[4] = '\0';
    o_info_hash[5] = '\0';
    o_info_hash[6] = '\0';
    o_info_hash[7] = '\0';
    ikmlen = infolen + 0x1a;
    uVar14 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    lVar12 = -uVar14;
    puVar13 = (uint8_t *)((long)&uStack_1e8 + lVar12);
    *(undefined8 *)((long)&uStack_1f0 + lVar12) = 0x167d7f;
    memset(puVar13,0,(ulong)ikmlen);
    builtin_memcpy((uint8_t *)((long)&uStack_1e8 + lVar12),"HPKE",4);
    *(undefined2 *)((long)&uStack_1e4 + lVar12) = 0x762d;
    (&uStack_1e2)[lVar12] = '1';
    *(undefined8 *)((long)&uStack_1e1 + lVar12) = local_108;
    *(undefined2 *)((long)&uStack_1d9 + lVar12) = local_100;
    *(undefined8 *)(auStack_1d7 + lVar12) = 0x7361685f6f666e69;
    auStack_1cf[-uVar14] = 0x68;
    *(undefined8 *)((long)&uStack_1f0 + lVar12) = 0x167dda;
    memcpy(auStack_1cf + lVar12 + 1,info,(ulong)infolen);
    *(undefined8 *)((long)&uStack_1f0 + lVar12) = 0x167df4;
    Hacl_HKDF_extract_sha2_512((uint8_t *)&uStack_1c8,(uint8_t *)&local_108,0,puVar13,ikmlen);
    uVar6 = o_info_hash._56_8_;
    uVar5 = o_info_hash._48_8_;
    uVar4 = o_info_hash._40_8_;
    uVar3 = o_info_hash._32_8_;
    uStack_b8 = uStack_1c8;
    o_dh[0] = o_info_hash[0];
    o_dh[1] = o_info_hash[1];
    o_dh[2] = o_info_hash[2];
    o_dh[3] = o_info_hash[3];
    o_dh[4] = o_info_hash[4];
    o_dh[5] = o_info_hash[5];
    o_dh[6] = o_info_hash[6];
    o_dh[7] = o_info_hash[7];
    o_dh[8] = o_info_hash[8];
    o_dh[9] = o_info_hash[9];
    o_dh[10] = o_info_hash[10];
    o_dh[0xb] = o_info_hash[0xb];
    o_dh[0xc] = o_info_hash[0xc];
    o_dh[0xd] = o_info_hash[0xd];
    o_dh[0xe] = o_info_hash[0xe];
    o_dh[0xf] = o_info_hash[0xf];
    o_dh[0x10] = o_info_hash[0x10];
    o_dh[0x11] = o_info_hash[0x11];
    o_dh[0x12] = o_info_hash[0x12];
    o_dh[0x13] = o_info_hash[0x13];
    o_dh[0x14] = o_info_hash[0x14];
    o_dh[0x15] = o_info_hash[0x15];
    o_dh[0x16] = o_info_hash[0x16];
    o_dh[0x17] = o_info_hash[0x17];
    o_dh[0x18] = o_info_hash[0x18];
    o_dh[0x19] = o_info_hash[0x19];
    o_dh[0x1a] = o_info_hash[0x1a];
    o_dh[0x1b] = o_info_hash[0x1b];
    o_dh[0x1c] = o_info_hash[0x1c];
    o_dh[0x1d] = o_info_hash[0x1d];
    o_dh[0x1e] = o_info_hash[0x1e];
    o_dh[0x1f] = o_info_hash[0x1f];
    builtin_memcpy(local_208 + lVar12,"HPKE",4);
    *(undefined2 *)((long)&local_204 + lVar12) = 0x762d;
    (&local_202)[lVar12] = 0x31;
    *(undefined8 *)((long)&local_201 + lVar12) = local_108;
    *(undefined2 *)(auStack_1f8 + lVar12 + -1) = local_100;
    *(undefined4 *)(auStack_1f8 + lVar12 + 1) = 0x72636573;
    *(undefined2 *)(local_1f5 + lVar12 + 2) = 0x7465;
    *(undefined8 *)((long)&uStack_210 + lVar12) = 0x17;
    uVar1 = *(undefined8 *)((long)&uStack_210 + lVar12);
    *(undefined8 *)((long)&uStack_210 + lVar12) = 0x20;
    uVar2 = *(undefined8 *)((long)&uStack_210 + lVar12);
    *(undefined8 *)((long)&uStack_210 + lVar12) = 0x167ea4;
    Hacl_HKDF_extract_sha2_512
              (auStack_148,auStack_f8,(uint32_t)uVar2,local_208 + lVar12,(uint32_t)uVar1);
    (auStack_2a8 + lVar12)[0] = '\0';
    (auStack_2a8 + lVar12)[1] = '@';
    puVar13 = auStack_2a8 + lVar12 + 2;
    puVar13[0] = 'H';
    puVar13[1] = 'P';
    puVar13[2] = 'K';
    puVar13[3] = 'E';
    *(undefined2 *)((long)&uStack_2a2 + lVar12) = 0x762d;
    (&uStack_2a0)[lVar12] = 0x31;
    *(undefined8 *)((long)&uStack_29f + lVar12) = local_108;
    *(undefined2 *)((long)&uStack_297 + lVar12) = local_100;
    puVar13 = auStack_291 + lVar12 + -4;
    puVar13[0] = 'e';
    puVar13[1] = 'x';
    puVar13[2] = 'p';
    puVar13[3] = '\0';
    *(undefined8 *)(auStack_261 + lVar12) = 0;
    *(undefined8 *)(auStack_259 + lVar12) = 0;
    *(undefined8 *)(&stack0xfffffffffffffd8f + lVar12) = 0;
    *(undefined8 *)(auStack_270 + lVar12 + 7) = 0;
    *(undefined8 *)((long)auStack_289 + lVar12 + 8) = 0;
    *(undefined8 *)((long)auStack_289 + lVar12 + 0x10) = 0;
    *(undefined8 *)(auStack_291 + lVar12) = uVar6;
    *(undefined8 *)((long)auStack_289 + lVar12) = 0;
    uVar8 = o_dh._24_8_;
    uVar7 = o_dh._16_8_;
    uVar2 = o_dh._8_8_;
    uVar1 = o_dh._0_8_;
    *(undefined8 *)(auStack_251 + lVar12) = uStack_b8;
    *(undefined8 *)(auStack_249 + lVar12) = uVar1;
    *(undefined8 *)((long)&uStack_245 + lVar12 + 4) = uVar2;
    *(undefined8 *)((long)&local_23d + lVar12 + 4) = uVar7;
    *(undefined8 *)((long)&uStack_235 + lVar12 + 4) = uVar8;
    *(undefined8 *)((long)&local_22d + lVar12 + 4) = uVar3;
    *(undefined8 *)((long)&uStack_225 + lVar12 + 4) = uVar4;
    *(undefined8 *)((long)&local_21d + lVar12 + 4) = uVar5;
    *(undefined8 *)((long)&uStack_2b0 + lVar12) = 0x40;
    prklen = (uint32_t)*(undefined8 *)((long)&uStack_2b0 + lVar12);
    *(undefined8 *)((long)&uStack_2b0 + lVar12) = 0x167f5b;
    Hacl_HKDF_expand_sha2_512
              (o_ctx.ctx_exporter,auStack_148,prklen,auStack_2a8 + lVar12,0x97,prklen);
    (auStack_348 + lVar12)[0] = '\0';
    (auStack_348 + lVar12)[1] = ' ';
    puVar13 = auStack_348 + lVar12 + 2;
    puVar13[0] = 'H';
    puVar13[1] = 'P';
    puVar13[2] = 'K';
    puVar13[3] = 'E';
    *(undefined2 *)((long)&uStack_342 + lVar12) = 0x762d;
    (&uStack_340)[lVar12] = 0x31;
    *(undefined8 *)((long)&uStack_33f + lVar12) = local_108;
    *(undefined2 *)((long)&uStack_337 + lVar12) = local_100;
    puVar13 = auStack_331 + lVar12 + -4;
    puVar13[0] = 'k';
    puVar13[1] = 'e';
    puVar13[2] = 'y';
    puVar13[3] = '\0';
    *(undefined8 *)((long)auStack_329 + lVar12 + 0x28) = 0;
    *(undefined8 *)((long)auStack_329 + lVar12 + 0x30) = 0;
    *(undefined8 *)((long)auStack_329 + lVar12 + 0x18) = 0;
    *(undefined8 *)((long)auStack_329 + lVar12 + 0x20) = 0;
    *(undefined8 *)((long)auStack_329 + lVar12 + 8) = 0;
    *(undefined8 *)((long)auStack_329 + lVar12 + 0x10) = 0;
    *(undefined8 *)(auStack_331 + lVar12) = uVar6;
    *(undefined8 *)((long)auStack_329 + lVar12) = 0;
    uVar8 = o_dh._24_8_;
    uVar7 = o_dh._16_8_;
    uVar2 = o_dh._8_8_;
    uVar1 = o_dh._0_8_;
    *(undefined8 *)((long)auStack_329 + lVar12 + 0x38) = uStack_b8;
    *(undefined8 *)(auStack_2e9 + lVar12) = uVar1;
    *(undefined8 *)(auStack_2e1 + lVar12) = uVar2;
    *(undefined8 *)(auStack_2d9 + lVar12) = uVar7;
    *(undefined8 *)(auStack_2d1 + lVar12) = uVar8;
    *(undefined8 *)(auStack_2c9 + lVar12) = uVar3;
    *(undefined8 *)(auStack_2c1 + lVar12) = uVar4;
    *(undefined8 *)(auStack_2b9 + lVar12) = uVar5;
    puVar10 = auStack_352 + lVar12 + 2;
    puVar10[0] = ' ';
    puVar10[1] = '\0';
    puVar10[2] = '\0';
    puVar10[3] = '\0';
    puVar10[4] = '\0';
    puVar10[5] = '\0';
    puVar10[6] = '\0';
    puVar10[7] = '\0';
    uVar1 = *(undefined8 *)(auStack_352 + lVar12 + 2);
    puVar11 = auStack_352 + lVar12 + 2;
    puVar11[0] = '\x19';
    puVar11[1] = 0x80;
    puVar11[2] = '\x16';
    puVar11[3] = '\0';
    puVar11[4] = '\0';
    puVar11[5] = '\0';
    puVar11[6] = '\0';
    puVar11[7] = '\0';
    Hacl_HKDF_expand_sha2_512
              (o_ctx.ctx_key,auStack_148,prklen,auStack_348 + lVar12,0x97,(uint32_t)uVar1);
    (auStack_3e8 + lVar12)[0] = '\0';
    (auStack_3e8 + lVar12)[1] = '\f';
    puVar13 = auStack_3e8 + lVar12 + 2;
    puVar13[0] = 'H';
    puVar13[1] = 'P';
    puVar13[2] = 'K';
    puVar13[3] = 'E';
    *(undefined2 *)((long)&uStack_3e2 + lVar12) = 0x762d;
    (&uStack_3e0)[lVar12] = 0x31;
    *(undefined8 *)((long)&uStack_3df + lVar12) = local_108;
    *(undefined2 *)((long)&uStack_3d7 + lVar12) = local_100;
    *(undefined8 *)((long)&uStack_3d5 + lVar12) = 0x6e6f6e5f65736162;
    *(undefined2 *)((long)&uStack_3cd + lVar12) = 0x6563;
    auStack_3cb[lVar12] = '\0';
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 0x28) = 0;
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 0x30) = 0;
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 0x18) = 0;
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 0x20) = 0;
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 8) = 0;
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 0x10) = 0;
    *(undefined8 *)(auStack_3cb + lVar12 + 1) = uVar6;
    *(undefined8 *)((long)auStack_3c2 + lVar12) = 0;
    uVar7 = o_dh._24_8_;
    uVar6 = o_dh._16_8_;
    uVar2 = o_dh._8_8_;
    uVar1 = o_dh._0_8_;
    *(undefined8 *)((long)auStack_3c2 + lVar12 + 0x38) = uStack_b8;
    *(undefined8 *)(auStack_382 + lVar12) = uVar1;
    *(undefined8 *)(auStack_37a + lVar12) = uVar2;
    *(undefined8 *)(auStack_372 + lVar12) = uVar6;
    *(undefined8 *)(auStack_36a + lVar12) = uVar7;
    *(undefined8 *)(auStack_362 + lVar12) = uVar3;
    *(undefined8 *)(auStack_35a + lVar12) = uVar4;
    *(undefined8 *)(auStack_352 + lVar12) = uVar5;
    *(undefined8 *)((long)&uStack_3f0 + lVar12) = 0xc;
    uVar1 = *(undefined8 *)((long)&uStack_3f0 + lVar12);
    *(undefined8 *)((long)&uStack_3f0 + lVar12) = 0x1680e5;
    Hacl_HKDF_expand_sha2_512
              (o_ctx.ctx_nonce,auStack_148,prklen,auStack_3e8 + lVar12,0x9e,(uint32_t)uVar1);
    *o_ctx.ctx_seq = 0;
  }
  return (uint)(bVar15 == 0xff);
}

Assistant:

uint32_t
Hacl_HPKE_Curve64_CP32_SHA512_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_64_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_64_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[129U] = { 0U };
    uint8_t o_secret[64U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 3U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[64U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[64U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 64U * sizeof (uint8_t));
    memcpy(o_context + 65U, o_info_hash, 64U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)64U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter, o_secret, 64U, tmp3, len3, 64U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key, o_secret, 64U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 158U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce, o_secret, 64U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}